

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

void __thiscall cashew::JSPrinter::printStats(JSPrinter *this,Ref stats)

{
  Ref node;
  bool bVar1;
  bool bVar2;
  size_t sVar3;
  undefined8 *puVar4;
  size_t i;
  ulong uVar5;
  Value *local_38;
  Ref stats_local;
  
  bVar2 = true;
  uVar5 = 0;
  local_38 = stats.inst;
  while( true ) {
    sVar3 = Value::size(local_38);
    if (sVar3 <= uVar5) break;
    puVar4 = (undefined8 *)cashew::Ref::operator[]((uint)&local_38);
    node.inst = (Value *)*puVar4;
    bVar1 = isNothing(this,node);
    if (!bVar1) {
      if (!bVar2) {
        newline(this);
      }
      print(this,node);
      bVar2 = isDefun(this,node);
      if (!bVar2) {
        bVar2 = endsInBlock(this,node);
        if (!bVar2) {
          bVar2 = isIf(this,node);
          if (!bVar2) {
            emit(this,';');
          }
        }
      }
      bVar2 = false;
    }
    uVar5 = uVar5 + 1;
  }
  return;
}

Assistant:

void printStats(Ref stats) {
    bool first = true;
    for (size_t i = 0; i < stats->size(); i++) {
      Ref curr = stats[i];
      if (!isNothing(curr)) {
        if (first) {
          first = false;
        } else {
          newline();
        }
        print(curr);
        if (!isDefun(curr) && !endsInBlock(curr) && !isIf(curr)) {
          emit(';');
        }
      }
    }
  }